

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O3

void xmlSAX2StartElementNs
               (void *ctx,xmlChar *localname,xmlChar *prefix,xmlChar *URI,int nb_namespaces,
               xmlChar **namespaces,int nb_attributes,int nb_defaulted,xmlChar **attributes)

{
  xmlNodePtr cur;
  long lVar1;
  uint uVar2;
  int iVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  xmlRegisterNodeFunc *pp_Var6;
  xmlNodePtr cur_00;
  xmlNsPtr ns;
  xmlNsPtr pxVar7;
  uint uVar8;
  xmlChar *value;
  char *msg;
  xmlDocPtr pxVar9;
  xmlChar *valueend;
  xmlChar **ppxVar10;
  
  if (ctx == (void *)0x0) {
    return;
  }
  cur = *(xmlNodePtr *)((long)ctx + 0x50);
  if (((*(int *)((long)ctx + 0x9c) != 0) && (*(long *)(*(long *)((long)ctx + 0x10) + 0x58) == 0)) &&
     ((lVar1 = *(long *)(*(long *)((long)ctx + 0x10) + 0x50), lVar1 == 0 ||
      ((((*(long *)(lVar1 + 0x48) == 0 && (*(long *)(lVar1 + 0x50) == 0)) &&
        (*(long *)(lVar1 + 0x58) == 0)) && (*(long *)(lVar1 + 0x60) == 0)))))) {
    xmlErrValid((xmlParserCtxtPtr)ctx,XML_DTD_NO_DTD,"Validation failed: no DTD found !",(char *)0x0
                ,(char *)0x0);
    *(undefined4 *)((long)ctx + 0x9c) = 0;
  }
  if (URI == (xmlChar *)0x0 && prefix != (xmlChar *)0x0) {
    if (*(int *)((long)ctx + 0x238) != 0) {
      pxVar4 = xmlDictQLookup(*(xmlDictPtr *)((long)ctx + 0x1c8),prefix,localname);
      if (pxVar4 != (xmlChar *)0x0) {
        localname = pxVar4;
      }
      goto LAB_0017be91;
    }
    pxVar4 = xmlBuildQName(localname,prefix,(xmlChar *)0x0,0);
  }
  else {
LAB_0017be91:
    pxVar4 = (xmlChar *)0x0;
  }
  cur_00 = *(xmlNodePtr *)((long)ctx + 0x240);
  if (cur_00 == (xmlNodePtr)0x0) {
    if (*(int *)((long)ctx + 0x238) == 0) {
      pxVar9 = *(xmlDocPtr *)((long)ctx + 0x10);
      if (pxVar4 != (xmlChar *)0x0) goto LAB_0017bfed;
      cur_00 = xmlNewDocNode(pxVar9,(xmlNsPtr)0x0,localname,(xmlChar *)0x0);
    }
    else {
      pxVar9 = *(xmlDocPtr *)((long)ctx + 0x10);
      pxVar4 = localname;
LAB_0017bfed:
      cur_00 = xmlNewDocNodeEatName(pxVar9,(xmlNsPtr)0x0,pxVar4,(xmlChar *)0x0);
    }
    if (cur_00 == (xmlNodePtr)0x0) goto LAB_0017c229;
  }
  else {
    *(_xmlNode **)((long)ctx + 0x240) = cur_00->next;
    *(int *)((long)ctx + 0x23c) = *(int *)((long)ctx + 0x23c) + -1;
    cur_00->nsDef = (xmlNs *)0x0;
    cur_00->psvi = (void *)0x0;
    cur_00->content = (xmlChar *)0x0;
    cur_00->properties = (_xmlAttr *)0x0;
    cur_00->doc = (_xmlDoc *)0x0;
    cur_00->ns = (xmlNs *)0x0;
    cur_00->next = (_xmlNode *)0x0;
    cur_00->prev = (_xmlNode *)0x0;
    cur_00->last = (_xmlNode *)0x0;
    cur_00->parent = (_xmlNode *)0x0;
    cur_00->name = (xmlChar *)0x0;
    cur_00->children = (_xmlNode *)0x0;
    cur_00->_private = (void *)0x0;
    *(undefined8 *)&cur_00->type = 0;
    cur_00->line = 0;
    cur_00->extra = 0;
    *(undefined4 *)&cur_00->field_0x74 = 0;
    cur_00->doc = *(_xmlDoc **)((long)ctx + 0x10);
    cur_00->type = XML_ELEMENT_NODE;
    pxVar5 = localname;
    if ((*(int *)((long)ctx + 0x238) == 0) && (pxVar5 = pxVar4, pxVar4 == (xmlChar *)0x0)) {
      pxVar4 = xmlStrdup(localname);
      cur_00->name = pxVar4;
      if (pxVar4 == (xmlChar *)0x0) goto LAB_0017c229;
    }
    else {
      cur_00->name = pxVar5;
    }
    if ((__xmlRegisterCallbacks != 0) &&
       (pp_Var6 = __xmlRegisterNodeDefaultValue(), *pp_Var6 != (xmlRegisterNodeFunc)0x0)) {
      pp_Var6 = __xmlRegisterNodeDefaultValue();
      (**pp_Var6)(cur_00);
    }
  }
  if ((*(int *)((long)ctx + 0x1b4) != 0) && (*(long *)((long)ctx + 0x38) != 0)) {
    uVar2 = *(uint *)(*(long *)((long)ctx + 0x38) + 0x34);
    uVar8 = 0xffff;
    if (uVar2 < 0xffff) {
      uVar8 = uVar2;
    }
    cur_00->line = (unsigned_short)uVar8;
  }
  if (cur == (xmlNodePtr)0x0) {
    xmlAddChild(*(xmlNodePtr *)((long)ctx + 0x10),cur_00);
  }
  if (0 < nb_namespaces) {
    ppxVar10 = namespaces + 1;
    pxVar7 = (xmlNsPtr)0x0;
    do {
      pxVar4 = ppxVar10[-1];
      pxVar5 = *ppxVar10;
      ns = xmlNewNs((xmlNodePtr)0x0,pxVar5,pxVar4);
      if (ns != (xmlNsPtr)0x0) {
        if (pxVar7 == (xmlNsPtr)0x0) {
          pxVar7 = (xmlNsPtr)&cur_00->nsDef;
        }
        pxVar7->next = ns;
        if (pxVar4 == prefix && URI != (xmlChar *)0x0) {
          cur_00->ns = ns;
        }
        pxVar7 = ns;
        if ((((*(int *)((long)ctx + 0x34) == 0) && (*(int *)((long)ctx + 0x9c) != 0)) &&
            (*(int *)((long)ctx + 0x18) != 0)) &&
           ((pxVar9 = *(xmlDocPtr *)((long)ctx + 0x10), pxVar9 != (xmlDocPtr)0x0 &&
            (pxVar9->intSubset != (_xmlDtd *)0x0)))) {
          uVar2 = xmlValidateOneNamespace
                            ((xmlValidCtxtPtr)((long)ctx + 0xa0),pxVar9,cur_00,prefix,ns,pxVar5);
          *(uint *)((long)ctx + 0x98) = *(uint *)((long)ctx + 0x98) & uVar2;
        }
      }
      ppxVar10 = ppxVar10 + 2;
      nb_namespaces = nb_namespaces + -1;
    } while (nb_namespaces != 0);
  }
  *(undefined4 *)((long)ctx + 0x1a0) = 0xffffffff;
  iVar3 = nodePush((xmlParserCtxtPtr)ctx,cur_00);
  if (iVar3 < 0) {
    xmlUnlinkNode(cur_00);
    xmlFreeNode(cur_00);
    return;
  }
  if (cur != (xmlNodePtr)0x0) {
    if (cur->type == XML_ELEMENT_NODE) {
      xmlAddChild(cur,cur_00);
    }
    else {
      xmlAddSibling(cur,cur_00);
    }
  }
  if (nb_defaulted != 0) {
    iVar3 = 0;
    if ((*(byte *)((long)ctx + 0x1b0) & 4) == 0) {
      iVar3 = nb_defaulted;
    }
    nb_attributes = nb_attributes - iVar3;
  }
  if ((URI != (xmlChar *)0x0) && (cur_00->ns == (xmlNs *)0x0)) {
    pxVar7 = xmlSearchNs(*(xmlDocPtr *)((long)ctx + 0x10),cur,prefix);
    cur_00->ns = pxVar7;
    if (pxVar7 == (xmlNsPtr)0x0) {
      iVar3 = xmlStrEqual(prefix,"xml");
      if (iVar3 == 0) {
        pxVar7 = cur_00->ns;
      }
      else {
        pxVar7 = xmlSearchNs(*(xmlDocPtr *)((long)ctx + 0x10),cur_00,prefix);
        cur_00->ns = pxVar7;
      }
      if (pxVar7 == (xmlNsPtr)0x0) {
        pxVar7 = xmlNewNs(cur_00,(xmlChar *)0x0,prefix);
        if (pxVar7 == (xmlNsPtr)0x0) {
LAB_0017c229:
          xmlSAX2ErrMemory((xmlParserCtxtPtr)ctx,"xmlSAX2StartElementNs");
          return;
        }
        if (prefix == (xmlChar *)0x0) {
          msg = "Namespace default prefix was not found\n";
          prefix = (xmlChar *)0x0;
        }
        else {
          msg = "Namespace prefix %s was not found\n";
        }
        xmlNsWarnMsg((xmlParserCtxtPtr)ctx,XML_NS_ERR_UNDEFINED_NAMESPACE,msg,prefix,(xmlChar *)0x0)
        ;
      }
    }
  }
  if (0 < nb_attributes) {
    ppxVar10 = attributes + 4;
    do {
      pxVar4 = ppxVar10[-3];
      if ((pxVar4 == (xmlChar *)0x0) || (ppxVar10[-2] != (xmlChar *)0x0)) {
LAB_0017c2d1:
        pxVar4 = ppxVar10[-4];
        pxVar5 = ppxVar10[-3];
        value = ppxVar10[-1];
        valueend = *ppxVar10;
LAB_0017c2e7:
        xmlSAX2AttributeNs((xmlParserCtxtPtr)ctx,pxVar4,pxVar5,value,valueend);
      }
      else {
        if (*(int *)((long)ctx + 0x238) != 0) {
          pxVar4 = xmlDictQLookup(*(xmlDictPtr *)((long)ctx + 0x1c8),pxVar4,ppxVar10[-4]);
          if (pxVar4 == (xmlChar *)0x0) goto LAB_0017c2d1;
          value = ppxVar10[-1];
          valueend = *ppxVar10;
          pxVar5 = (xmlChar *)0x0;
          goto LAB_0017c2e7;
        }
        pxVar4 = xmlBuildQName(ppxVar10[-4],pxVar4,(xmlChar *)0x0,0);
        if (pxVar4 == (xmlChar *)0x0) goto LAB_0017c2d1;
        xmlSAX2AttributeNs((xmlParserCtxtPtr)ctx,pxVar4,(xmlChar *)0x0,ppxVar10[-1],*ppxVar10);
        (*xmlFree)(pxVar4);
      }
      ppxVar10 = ppxVar10 + 5;
      nb_attributes = nb_attributes + -1;
    } while (nb_attributes != 0);
  }
  if ((*(int *)((long)ctx + 0x9c) != 0) && ((*(byte *)((long)ctx + 0xd0) & 1) == 0)) {
    iVar3 = xmlValidateDtdFinal((xmlValidCtxtPtr)((long)ctx + 0xa0),*(xmlDocPtr *)((long)ctx + 0x10)
                               );
    if ((iVar3 < 1) && (*(undefined4 *)((long)ctx + 0x98) = 0, iVar3 < 0)) {
      *(undefined4 *)((long)ctx + 0x18) = 0;
    }
    uVar2 = xmlValidateRoot((xmlValidCtxtPtr)((long)ctx + 0xa0),*(xmlDocPtr *)((long)ctx + 0x10));
    *(uint *)((long)ctx + 0x98) = *(uint *)((long)ctx + 0x98) & uVar2;
    *(byte *)((long)ctx + 0xd0) = *(byte *)((long)ctx + 0xd0) | 1;
  }
  return;
}

Assistant:

void
xmlSAX2StartElementNs(void *ctx,
                      const xmlChar *localname,
		      const xmlChar *prefix,
		      const xmlChar *URI,
		      int nb_namespaces,
		      const xmlChar **namespaces,
		      int nb_attributes,
		      int nb_defaulted,
		      const xmlChar **attributes)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlNodePtr ret;
    xmlNodePtr parent;
    xmlNsPtr last = NULL, ns;
    const xmlChar *uri, *pref;
    xmlChar *lname = NULL;
    int i, j;

    if (ctx == NULL) return;
    parent = ctxt->node;
    /*
     * First check on validity:
     */
    if (ctxt->validate && (ctxt->myDoc->extSubset == NULL) &&
        ((ctxt->myDoc->intSubset == NULL) ||
	 ((ctxt->myDoc->intSubset->notations == NULL) &&
	  (ctxt->myDoc->intSubset->elements == NULL) &&
	  (ctxt->myDoc->intSubset->attributes == NULL) &&
	  (ctxt->myDoc->intSubset->entities == NULL)))) {
	xmlErrValid(ctxt, XML_DTD_NO_DTD,
	  "Validation failed: no DTD found !", NULL, NULL);
	ctxt->validate = 0;
    }

    /*
     * Take care of the rare case of an undefined namespace prefix
     */
    if ((prefix != NULL) && (URI == NULL)) {
        if (ctxt->dictNames) {
	    const xmlChar *fullname;

	    fullname = xmlDictQLookup(ctxt->dict, prefix, localname);
	    if (fullname != NULL)
	        localname = fullname;
	} else {
	    lname = xmlBuildQName(localname, prefix, NULL, 0);
	}
    }
    /*
     * allocate the node
     */
    if (ctxt->freeElems != NULL) {
        ret = ctxt->freeElems;
	ctxt->freeElems = ret->next;
	ctxt->freeElemsNr--;
	memset(ret, 0, sizeof(xmlNode));
        ret->doc = ctxt->myDoc;
	ret->type = XML_ELEMENT_NODE;

	if (ctxt->dictNames)
	    ret->name = localname;
	else {
	    if (lname == NULL)
		ret->name = xmlStrdup(localname);
	    else
	        ret->name = lname;
	    if (ret->name == NULL) {
	        xmlSAX2ErrMemory(ctxt, "xmlSAX2StartElementNs");
		return;
	    }
	}
	if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	    xmlRegisterNodeDefaultValue(ret);
    } else {
	if (ctxt->dictNames)
	    ret = xmlNewDocNodeEatName(ctxt->myDoc, NULL,
	                               (xmlChar *) localname, NULL);
	else if (lname == NULL)
	    ret = xmlNewDocNode(ctxt->myDoc, NULL, localname, NULL);
	else
	    ret = xmlNewDocNodeEatName(ctxt->myDoc, NULL,
	                               (xmlChar *) lname, NULL);
	if (ret == NULL) {
	    xmlSAX2ErrMemory(ctxt, "xmlSAX2StartElementNs");
	    return;
	}
    }
    if (ctxt->linenumbers) {
	if (ctxt->input != NULL) {
	    if ((unsigned) ctxt->input->line < (unsigned) USHRT_MAX)
		ret->line = ctxt->input->line;
	    else
	        ret->line = USHRT_MAX;
	}
    }

    if (parent == NULL) {
        xmlAddChild((xmlNodePtr) ctxt->myDoc, (xmlNodePtr) ret);
    }
    /*
     * Build the namespace list
     */
    for (i = 0,j = 0;j < nb_namespaces;j++) {
        pref = namespaces[i++];
	uri = namespaces[i++];
	ns = xmlNewNs(NULL, uri, pref);
	if (ns != NULL) {
	    if (last == NULL) {
	        ret->nsDef = last = ns;
	    } else {
	        last->next = ns;
		last = ns;
	    }
	    if ((URI != NULL) && (prefix == pref))
		ret->ns = ns;
	} else {
            /*
             * any out of memory error would already have been raised
             * but we can't be guaranteed it's the actual error due to the
             * API, best is to skip in this case
             */
	    continue;
	}
#ifdef LIBXML_VALID_ENABLED
	if ((!ctxt->html) && ctxt->validate && ctxt->wellFormed &&
	    ctxt->myDoc && ctxt->myDoc->intSubset) {
	    ctxt->valid &= xmlValidateOneNamespace(&ctxt->vctxt, ctxt->myDoc,
	                                           ret, prefix, ns, uri);
	}
#endif /* LIBXML_VALID_ENABLED */
    }
    ctxt->nodemem = -1;

    /*
     * We are parsing a new node.
     */
    if (nodePush(ctxt, ret) < 0) {
        xmlUnlinkNode(ret);
        xmlFreeNode(ret);
        return;
    }

    /*
     * Link the child element
     */
    if (parent != NULL) {
        if (parent->type == XML_ELEMENT_NODE) {
	    xmlAddChild(parent, ret);
	} else {
	    xmlAddSibling(parent, ret);
	}
    }

    /*
     * Insert the defaulted attributes from the DTD only if requested:
     */
    if ((nb_defaulted != 0) &&
        ((ctxt->loadsubset & XML_COMPLETE_ATTRS) == 0))
	nb_attributes -= nb_defaulted;

    /*
     * Search the namespace if it wasn't already found
     * Note that, if prefix is NULL, this searches for the default Ns
     */
    if ((URI != NULL) && (ret->ns == NULL)) {
        ret->ns = xmlSearchNs(ctxt->myDoc, parent, prefix);
	if ((ret->ns == NULL) && (xmlStrEqual(prefix, BAD_CAST "xml"))) {
	    ret->ns = xmlSearchNs(ctxt->myDoc, ret, prefix);
	}
	if (ret->ns == NULL) {
	    ns = xmlNewNs(ret, NULL, prefix);
	    if (ns == NULL) {

	        xmlSAX2ErrMemory(ctxt, "xmlSAX2StartElementNs");
		return;
	    }
            if (prefix != NULL)
                xmlNsWarnMsg(ctxt, XML_NS_ERR_UNDEFINED_NAMESPACE,
                             "Namespace prefix %s was not found\n",
                             prefix, NULL);
            else
                xmlNsWarnMsg(ctxt, XML_NS_ERR_UNDEFINED_NAMESPACE,
                             "Namespace default prefix was not found\n",
                             NULL, NULL);
	}
    }

    /*
     * process all the other attributes
     */
    if (nb_attributes > 0) {
        for (j = 0,i = 0;i < nb_attributes;i++,j+=5) {
	    /*
	     * Handle the rare case of an undefined attribute prefix
	     */
	    if ((attributes[j+1] != NULL) && (attributes[j+2] == NULL)) {
		if (ctxt->dictNames) {
		    const xmlChar *fullname;

		    fullname = xmlDictQLookup(ctxt->dict, attributes[j+1],
		                              attributes[j]);
		    if (fullname != NULL) {
			xmlSAX2AttributeNs(ctxt, fullname, NULL,
			                   attributes[j+3], attributes[j+4]);
		        continue;
		    }
		} else {
		    lname = xmlBuildQName(attributes[j], attributes[j+1],
		                          NULL, 0);
		    if (lname != NULL) {
			xmlSAX2AttributeNs(ctxt, lname, NULL,
			                   attributes[j+3], attributes[j+4]);
			xmlFree(lname);
		        continue;
		    }
		}
	    }
	    xmlSAX2AttributeNs(ctxt, attributes[j], attributes[j+1],
			       attributes[j+3], attributes[j+4]);
	}
    }

#ifdef LIBXML_VALID_ENABLED
    /*
     * If it's the Document root, finish the DTD validation and
     * check the document root element for validity
     */
    if ((ctxt->validate) &&
        ((ctxt->vctxt.flags & XML_VCTXT_DTD_VALIDATED) == 0)) {
	int chk;

	chk = xmlValidateDtdFinal(&ctxt->vctxt, ctxt->myDoc);
	if (chk <= 0)
	    ctxt->valid = 0;
	if (chk < 0)
	    ctxt->wellFormed = 0;
	ctxt->valid &= xmlValidateRoot(&ctxt->vctxt, ctxt->myDoc);
	ctxt->vctxt.flags |= XML_VCTXT_DTD_VALIDATED;
    }
#endif /* LIBXML_VALID_ENABLED */
}